

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&,_const_type_safe::nullvar_t_&>
* __thiscall
Catch::
ExprLhs<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
::operator==(BinaryExpr<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&,_const_type_safe::nullvar_t_&>
             *__return_storage_ptr__,
            ExprLhs<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
            *this,nullvar_t *rhs)

{
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *pbVar1;
  unsigned_long uVar2;
  StringRef local_38;
  
  pbVar1 = *(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> **)this;
  uVar2 = (pbVar1->storage_).storage_.cur_type_.
          super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
          .value_;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = uVar2 == 0;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021ea90;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }